

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  ElimLt *this_00;
  Var x;
  Var x_00;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  piVar4 = (this->heap).data;
  lVar5 = (long)i;
  x = piVar4[lVar5];
  iVar8 = i * 2 + 1;
  iVar1 = (this->heap).sz;
  if (iVar8 < iVar1) {
    iVar7 = i * 2;
    this_00 = &this->lt;
    do {
      iVar6 = iVar7 + 2;
      if (iVar6 < iVar1) {
        x_00 = piVar4[iVar8];
        uVar2 = SimpSolver::ElimLt::cost(this_00,piVar4[iVar6]);
        uVar3 = SimpSolver::ElimLt::cost(this_00,x_00);
        lVar5 = (long)iVar6;
        if (uVar3 <= uVar2) {
          lVar5 = (long)iVar8;
          iVar6 = iVar8;
        }
      }
      else {
        lVar5 = (long)iVar8;
        iVar6 = iVar8;
      }
      uVar2 = SimpSolver::ElimLt::cost(this_00,(this->heap).data[lVar5]);
      uVar3 = SimpSolver::ElimLt::cost(this_00,x);
      piVar4 = (this->heap).data;
      if (uVar3 <= uVar2) break;
      iVar8 = piVar4[lVar5];
      piVar4[i] = iVar8;
      if ((this->indices).map.sz <= iVar8) goto LAB_00112af5;
      (this->indices).map.data[iVar8] = i;
      iVar7 = iVar6 * 2;
      iVar8 = iVar6 * 2 + 1;
      iVar1 = (this->heap).sz;
      i = iVar6;
    } while (iVar8 < iVar1);
    lVar5 = (long)i;
  }
  piVar4[lVar5] = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = i;
    return;
  }
LAB_00112af5:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }